

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_6027d3::Db::parseExprPrimary(Db *this)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  int iVar4;
  Node *pNVar5;
  Node *pNVar6;
  undefined **ppuVar7;
  char cVar8;
  char *pcVar9;
  long lVar10;
  short *psVar11;
  char *pcVar12;
  int *args;
  StringView SVar13;
  char *__end2;
  int local_38 [2];
  
  psVar2 = (short *)this->First;
  psVar3 = (short *)this->Last;
  if (psVar2 == psVar3) {
    return (Node *)0x0;
  }
  if ((char)*psVar2 != 'L') {
    return (Node *)0x0;
  }
  psVar1 = (short *)((long)psVar2 + 1);
  this->First = (char *)psVar1;
  if (psVar3 == psVar1) {
    cVar8 = '\0';
  }
  else {
    cVar8 = *(char *)psVar1;
  }
  switch(cVar8) {
  case 'T':
    return (Node *)0x0;
  default:
    pNVar5 = parseType(this);
    if (pNVar5 == (Node *)0x0) {
      return (Node *)0x0;
    }
    SVar13 = parseNumber(this,false);
    pcVar9 = this->First;
    if (SVar13.First != SVar13.Last) {
      if (pcVar9 == this->Last) {
        return (Node *)0x0;
      }
      if (*pcVar9 == 'E') {
        this->First = pcVar9 + 1;
        pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar6->K = KExpr;
        pNVar6->RHSComponentCache = No;
        pNVar6->ArrayCache = No;
        pNVar6->FunctionCache = No;
        pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0025b998;
        pNVar6[1]._vptr_Node = (_func_int **)pNVar5;
        *(StringView *)&pNVar6[1].K = SVar13;
        return pNVar6;
      }
      return (Node *)0x0;
    }
    if (pcVar9 == this->Last) {
      return (Node *)0x0;
    }
    goto LAB_001eea35;
  case '_':
    if ((ulong)((long)psVar3 - (long)psVar1) < 2) {
      return (Node *)0x0;
    }
    if (*psVar1 != 0x5a5f) {
      return (Node *)0x0;
    }
    this->First = (char *)((long)psVar2 + 3);
    pNVar5 = parseEncoding(this);
    if (pNVar5 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pcVar9 = this->First;
    if (pcVar9 == this->Last) {
      return (Node *)0x0;
    }
LAB_001eea35:
    if (*pcVar9 == 'E') {
      this->First = pcVar9 + 1;
      return pNVar5;
    }
    return (Node *)0x0;
  case 'a':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "signed char";
    pcVar9 = "";
    break;
  case 'b':
    if (((ulong)((long)psVar3 - (long)psVar1) < 3) ||
       (*(char *)((long)psVar2 + 3) != 'E' || *psVar1 != 0x3062)) {
      psVar2 = (short *)this->First;
      if ((ulong)((long)psVar3 - (long)psVar2) < 3) {
        return (Node *)0x0;
      }
      if ((char)psVar2[1] != 'E' || *psVar2 != 0x3162) {
        return (Node *)0x0;
      }
      this->First = (char *)((long)psVar2 + 3);
      args = local_38;
      local_38[0] = 1;
    }
    else {
      this->First = (char *)(psVar2 + 2);
      args = local_38 + 1;
      local_38[1] = 0;
    }
    pNVar5 = (Node *)(anonymous_namespace)::Db::make<(anonymous_namespace)::BoolExpr,int>
                               ((Db *)this,args);
    return pNVar5;
  case 'c':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "char";
    pcVar9 = "";
    break;
  case 'd':
    psVar1 = psVar2 + 1;
    this->First = (char *)psVar1;
    if ((ulong)((long)psVar3 - (long)psVar1) < 0x11) {
      return (Node *)0x0;
    }
    psVar11 = psVar2 + 9;
    lVar10 = 0;
    do {
      iVar4 = isxdigit((int)*(char *)((long)psVar1 + lVar10));
      if (iVar4 == 0) {
        return (Node *)0x0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
    this->First = (char *)psVar11;
    if (psVar11 == psVar3) {
      return (Node *)0x0;
    }
    if ((char)*psVar11 != 'E') {
      return (Node *)0x0;
    }
    this->First = (char *)((long)psVar2 + 0x13);
    pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar5->K = KExpr;
    pNVar5->RHSComponentCache = No;
    pNVar5->ArrayCache = No;
    pNVar5->FunctionCache = No;
    ppuVar7 = &PTR_hasRHSComponentSlow_0025b8e8;
    goto LAB_001ee907;
  case 'e':
    this->First = (char *)(psVar2 + 1);
    if ((ulong)((long)psVar3 - (long)(psVar2 + 1)) < 0x15) {
      return (Node *)0x0;
    }
    psVar11 = psVar2 + 0xb;
    lVar10 = 2;
    do {
      iVar4 = isxdigit((int)*(char *)((long)psVar2 + lVar10));
      if (iVar4 == 0) {
        return (Node *)0x0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x16);
    this->First = (char *)psVar11;
    if (psVar11 == psVar3) {
      return (Node *)0x0;
    }
    if ((char)*psVar11 != 'E') {
      return (Node *)0x0;
    }
    this->First = (char *)((long)psVar2 + 0x17);
    pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar5->K = KExpr;
    pNVar5->RHSComponentCache = No;
    pNVar5->ArrayCache = No;
    pNVar5->FunctionCache = No;
    ppuVar7 = &PTR_hasRHSComponentSlow_0025b940;
    goto LAB_001ee907;
  case 'f':
    psVar1 = psVar2 + 1;
    this->First = (char *)psVar1;
    if ((ulong)((long)psVar3 - (long)psVar1) < 9) {
      return (Node *)0x0;
    }
    psVar11 = psVar2 + 5;
    lVar10 = 0;
    do {
      iVar4 = isxdigit((int)*(char *)((long)psVar1 + lVar10));
      if (iVar4 == 0) {
        return (Node *)0x0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 8);
    this->First = (char *)psVar11;
    if (psVar11 == psVar3) {
      return (Node *)0x0;
    }
    if ((char)*psVar11 != 'E') {
      return (Node *)0x0;
    }
    this->First = (char *)((long)psVar2 + 0xb);
    pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar5->K = KExpr;
    pNVar5->RHSComponentCache = No;
    pNVar5->ArrayCache = No;
    pNVar5->FunctionCache = No;
    ppuVar7 = &PTR_hasRHSComponentSlow_0025b890;
LAB_001ee907:
    pNVar5->_vptr_Node = (_func_int **)ppuVar7;
    pNVar5[1]._vptr_Node = (_func_int **)(psVar2 + 1);
    *(short **)&pNVar5[1].K = psVar11;
    return pNVar5;
  case 'h':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "unsigned char";
    pcVar9 = "";
    break;
  case 'i':
    this->First = (char *)(psVar2 + 1);
    pcVar9 = "";
    pcVar12 = "";
    break;
  case 'j':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "u";
    pcVar9 = "";
    break;
  case 'l':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "l";
    pcVar9 = "";
    break;
  case 'm':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "ul";
    pcVar9 = "";
    break;
  case 'n':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "__int128";
    pcVar9 = "";
    break;
  case 'o':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "unsigned __int128";
    pcVar9 = "";
    break;
  case 's':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "short";
    pcVar9 = "";
    break;
  case 't':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "unsigned short";
    pcVar9 = "";
    break;
  case 'w':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "wchar_t";
    pcVar9 = "";
    break;
  case 'x':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "ll";
    pcVar9 = "";
    break;
  case 'y':
    this->First = (char *)(psVar2 + 1);
    pcVar12 = "ull";
    pcVar9 = "";
  }
  SVar13.Last = pcVar9;
  SVar13.First = pcVar12;
  pNVar5 = parseIntegerLiteral(this,SVar13);
  return pNVar5;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }